

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_http_msg.c
# Opt level: O3

_Bool uo_http_req_set_request_line
                (uo_http_req *http_req,uo_http_method method,char *uri,uo_http_ver version)

{
  uint uVar1;
  int iVar2;
  size_t __n;
  undefined *__src;
  size_t __n_00;
  size_t sVar3;
  long lVar4;
  _Bool _Var5;
  uint uVar6;
  size_t __n_01;
  char *ptr;
  uo_refcount *puVar7;
  void **__ptr;
  
  if (((uint)http_req->flags & 4) != 0) {
    uVar1 = method - UO_HTTP_GET;
    if (((uVar1 < 8) && (uVar6 = version - UO_HTTP_VER_1_0, uVar6 < 3)) && (*uri != '\0')) {
      __n = *(size_t *)(&DAT_0010a188 + (ulong)uVar1 * 8);
      iVar2 = *(int *)(&DAT_0010a1c8 + (ulong)uVar1 * 4);
      __src = (&PTR_anon_var_dwarf_2d32_0010edb8)[uVar6];
      __n_00 = *(size_t *)(&DAT_0010a3c8 + (ulong)uVar6 * 8);
      __n_01 = strlen(uri);
      ptr = (char *)malloc(__n_01 + __n_00 + __n + 5);
      puVar7 = uo_refcount_create(ptr,free);
      __ptr = (http_req->refstack).items;
      sVar3 = (http_req->refstack).count;
      (http_req->refstack).count = sVar3 + 1;
      if (sVar3 == (http_req->refstack).capacity) {
        (http_req->refstack).capacity = sVar3 * 2;
        __ptr = (void **)realloc(__ptr,sVar3 << 4);
        (http_req->refstack).items = __ptr;
      }
      __ptr[sVar3] = puVar7;
      memcpy(ptr,&DAT_0010a1c8 + iVar2,__n);
      (http_req->field_5).field_0.method_sp_uri = ptr;
      ptr[__n] = ' ';
      memcpy(ptr + __n + 1,uri,__n_01);
      (http_req->field_5).field_0.uri = ptr + __n + 1;
      lVar4 = __n_01 + __n + 1;
      ptr[__n_01 + 1 + __n] = '\0';
      memcpy(ptr + __n_01 + __n + 2,__src,__n_00);
      (http_req->field_5).field_0.version_crlf = ptr + __n_01 + __n + 2;
      (ptr + __n_00 + 1 + lVar4)[0] = '\r';
      (ptr + __n_00 + 1 + lVar4)[1] = '\n';
      ptr[__n_00 + 3 + lVar4] = '\0';
      http_req->ver = version;
      (http_req->field_5).field_0.method = method;
      *(byte *)&http_req->flags = *(byte *)&http_req->flags | 8;
      _Var5 = true;
    }
    else {
      _Var5 = false;
    }
    return _Var5;
  }
  __assert_fail("http_req->flags.role == UO_HTTP_MSG_ROLE_SEND",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UoLeevi[P]libuo/uo_http/src/uo_http_msg.c"
                ,0x80,
                "_Bool uo_http_req_set_request_line(uo_http_req *, uo_http_method, const char *, uo_http_ver)"
               );
}

Assistant:

bool uo_http_req_set_request_line(
    uo_http_req *http_req,
    uo_http_method method,
    const char *uri,
    uo_http_ver version)
{
    assert(http_req->flags.role == UO_HTTP_MSG_ROLE_SEND);

    const char *method_str;
    size_t method_str_len;
    switch (method)
    {
        case UO_HTTP_GET:     method_str = "GET";     method_str_len = 3; break;
        case UO_HTTP_HEAD:    method_str = "HEAD";    method_str_len = 4; break;
        case UO_HTTP_PUT:     method_str = "PUT";     method_str_len = 3; break;
        case UO_HTTP_DELETE:  method_str = "DELETE";  method_str_len = 6; break;
        case UO_HTTP_OPTIONS: method_str = "OPTIONS"; method_str_len = 7; break;
        case UO_HTTP_TRACE:   method_str = "TRACE";   method_str_len = 5; break;
        case UO_HTTP_POST:    method_str = "POST";    method_str_len = 4; break;
        case UO_HTTP_CONNECT: method_str = "CONNECT"; method_str_len = 7; break;
        default: return false;
    }

    const char *version_str;
    size_t version_str_len;
    switch (version)
    {
        case UO_HTTP_VER_1_0: version_str = "HTTP/1.0"; version_str_len = 8; break;
        case UO_HTTP_VER_1_1: version_str = "HTTP/1.1"; version_str_len = 8; break;
        case UO_HTTP_VER_2:   version_str = "HTTP/2";   version_str_len = 6; break;
        default: return false;
    }

    if (!*uri)
        return false;

    size_t uri_len = strlen(uri);

    char *p = malloc(method_str_len + uri_len + version_str_len + 5);
    uo_refstack_push(&http_req->refstack, p, free);

    http_req->method_sp_uri = memcpy(p, method_str, method_str_len);
    p += method_str_len;
    *p++ = ' ';

    http_req->uri = memcpy(p, uri, uri_len);
    p += uri_len;
    *p++ = '\0'; // replaced with ' ' before sending the message

    http_req->version_crlf = memcpy(p, version_str, version_str_len);
    p += version_str_len;
    *p++ = '\r';
    *p++ = '\n';
    *p++ = '\0';

    http_req->ver = version;
    http_req->method = method;

    return http_req->flags.start_line = true;
}